

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

string * __thiscall
t_c_glib_generator::generate_new_hash_from_type_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *key,t_type *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string value_free_func;
  string key_free_func;
  undefined1 local_68 [8];
  string cmp_func;
  string hash_func;
  t_type *value_local;
  t_type *key_local;
  t_c_glib_generator *this_local;
  
  generate_hash_func_from_type_abi_cxx11_((string *)((long)&cmp_func.field_2 + 8),this,key);
  generate_cmp_func_from_type_abi_cxx11_((string *)local_68,this,key);
  generate_free_func_from_type_abi_cxx11_((string *)((long)&value_free_func.field_2 + 8),this,key);
  generate_free_func_from_type_abi_cxx11_((string *)local_b8,this,value);
  std::operator+(&local_198,"g_hash_table_new_full (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cmp_func.field_2 + 8));
  std::operator+(&local_178,&local_198,", ");
  std::operator+(&local_158,&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::operator+(&local_138,&local_158,", ");
  std::operator+(&local_118,&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&value_free_func.field_2 + 8));
  std::operator+(&local_f8,&local_118,", ");
  std::operator+(&local_d8,&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  std::operator+(__return_storage_ptr__,&local_d8,");");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)(value_free_func.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(cmp_func.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::generate_new_hash_from_type(t_type* key, t_type* value) {
  string hash_func = generate_hash_func_from_type(key);
  string cmp_func = generate_cmp_func_from_type(key);
  string key_free_func = generate_free_func_from_type(key);
  string value_free_func = generate_free_func_from_type(value);

  return "g_hash_table_new_full (" + hash_func + ", " + cmp_func + ", " + key_free_func + ", "
         + value_free_func + ");";
}